

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O1

Vector3d * __thiscall OpenMD::Triangle::computeCentroid(Triangle *this)

{
  double dVar1;
  uint i;
  long lVar2;
  Vector3d *in_RDI;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  
  this->HaveCentroid_ = true;
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar2 = 0;
  do {
    result.data_[lVar2] =
         this->vertices_[0].super_Vector<double,_3U>.data_[lVar2] +
         (this->facetVelocity_).super_Vector<double,_3U>.data_[lVar2 + -8];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  result_1.data_[0] = 0.0;
  result_1.data_[1] = 0.0;
  result_1.data_[2] = 0.0;
  lVar2 = 0;
  do {
    result_1.data_[lVar2] =
         result.data_[lVar2] + (this->facetVelocity_).super_Vector<double,_3U>.data_[lVar2 + -5];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  result_2.data_[0] = 0.0;
  result_2.data_[1] = 0.0;
  result_2.data_[2] = 0.0;
  lVar2 = 0;
  do {
    result_2.data_[lVar2] = result_1.data_[lVar2] / 3.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (this->centroid_).super_Vector<double,_3U>.data_[2] = result_2.data_[2];
  (this->centroid_).super_Vector<double,_3U>.data_[0] = result_2.data_[0];
  (this->centroid_).super_Vector<double,_3U>.data_[1] = result_2.data_[1];
  (in_RDI->super_Vector<double,_3U>).data_[0] = 0.0;
  (in_RDI->super_Vector<double,_3U>).data_[1] = 0.0;
  (in_RDI->super_Vector<double,_3U>).data_[2] = 0.0;
  if (&this->centroid_ != in_RDI) {
    (in_RDI->super_Vector<double,_3U>).data_[2] =
         (this->centroid_).super_Vector<double,_3U>.data_[2];
    dVar1 = (this->centroid_).super_Vector<double,_3U>.data_[1];
    (in_RDI->super_Vector<double,_3U>).data_[0] =
         (this->centroid_).super_Vector<double,_3U>.data_[0];
    (in_RDI->super_Vector<double,_3U>).data_[1] = dVar1;
  }
  return in_RDI;
}

Assistant:

Vector3d Triangle::computeCentroid() {
  HaveCentroid_ = true;
  centroid_     = (vertices_[0] + vertices_[1] + vertices_[2]) / RealType(3.0);
  return centroid_;
}